

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O3

void printUImm12Offset2(MCInst *MI,uint OpNum,SStream *O,int Scale)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  _Bool _Var3;
  MCOperand *op;
  int64_t iVar4;
  undefined4 in_register_00000034;
  int iVar5;
  long val;
  
  op = MCInst_getOperand(MI,2);
  _Var3 = MCOperand_isImm(op);
  if (_Var3) {
    iVar4 = MCOperand_getImm(op);
    val = iVar4 * ((ulong)O & 0xffffffff);
    printInt64Bang((SStream *)CONCAT44(in_register_00000034,OpNum),val);
    if (MI->csh->detail != CS_OPT_OFF) {
      iVar5 = (int)val;
      if (MI->csh->doing_mem == true) {
        pcVar2 = MI->flat_insn->detail;
        *(int *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x3e) =
             iVar5;
      }
      else {
        pcVar2 = MI->flat_insn->detail;
        puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
        puVar1[0] = '\x02';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        pcVar2 = MI->flat_insn->detail;
        *(long *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
             (long)iVar5;
        puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar1 = *puVar1 + '\x01';
      }
    }
  }
  return;
}

Assistant:

static void printUImm12Offset2(MCInst *MI, unsigned OpNum, SStream *O, int Scale)
{
	printUImm12Offset(MI, OpNum, Scale, O);
}